

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

void set_scheme_id_uri(vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in,string *urn)

{
  pointer *ppuVar1;
  uchar *__args;
  uchar uVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  pointer puVar8;
  pointer puVar9;
  void *pvVar10;
  long lVar11;
  pointer puVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  string or_urn;
  allocator_type local_181;
  void *local_180;
  void *local_178;
  undefined1 *local_170;
  int local_168;
  undefined4 uStack_164;
  undefined1 local_160 [16];
  void *local_150;
  void *local_148;
  void *local_140;
  uchar *local_130 [2];
  uchar local_120 [16];
  uchar *local_110 [2];
  uchar local_100 [16];
  uchar *local_f0 [2];
  uchar local_e0 [16];
  uchar *local_d0 [2];
  uchar local_c0 [16];
  uchar *local_b0 [2];
  uchar local_a0 [16];
  uchar *local_90 [2];
  uchar local_80 [16];
  uchar *local_70 [2];
  uchar local_60 [16];
  uchar *local_50 [2];
  uchar local_40 [16];
  
  puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish + -0x10 != puVar8) {
    puVar12 = (pointer)0x0;
    do {
      puVar9 = puVar8 + (long)puVar12;
      local_170 = local_160;
      if (puVar8 == (pointer)0x0) {
        puVar8 = (pointer)0x1;
      }
      else {
        sVar6 = strlen((char *)puVar9);
        puVar8 = puVar9 + sVar6;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,puVar9,puVar8);
      iVar5 = std::__cxx11::string::compare((char *)&local_170);
      if (local_170 != local_160) {
        operator_delete(local_170);
      }
      if (iVar5 == 0) {
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_170 = local_160;
        if (puVar8 == (pointer)0x0) {
          puVar9 = (pointer)0x1;
        }
        else {
          sVar6 = strlen((char *)(puVar12 + (long)(puVar8 + 0x18)));
          puVar9 = puVar12 + (long)(puVar8 + sVar6 + 0x18);
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,puVar12 + (long)(puVar8 + 0x18),puVar9);
        iVar5 = local_168 - (int)urn->_M_string_length;
        if (iVar5 == 0) {
          if (urn->_M_string_length == 0) {
            pvVar13 = (void *)0x0;
            local_178 = (void *)0x0;
            pvVar10 = (void *)0x0;
            local_180 = (void *)0x0;
          }
          else {
            lVar11 = 0x18;
            uVar15 = 0;
            do {
              puVar12[(long)((moov_in->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar11)] =
                   (urn->_M_dataplus)._M_p[uVar15];
              uVar15 = uVar15 + 1;
              lVar11 = lVar11 + 1;
            } while (uVar15 < urn->_M_string_length);
            local_178 = (void *)0x0;
            pvVar10 = (void *)0x0;
            local_180 = (void *)0x0;
            pvVar13 = (void *)0x0;
          }
        }
        else {
          __first._M_current =
               (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,__first,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(__first._M_current + (long)(puVar12 + 0x18)),&local_181);
          pvVar10 = local_140;
          local_180 = local_148;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(puVar12 +
                       (long)((moov_in->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start +
                             CONCAT44(uStack_164,local_168) + 0x19)),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish,&local_181);
          pvVar13 = local_140;
          local_178 = local_148;
        }
        if (local_170 != local_160) {
          operator_delete(local_170);
        }
        goto LAB_00107e21;
      }
      puVar12 = puVar12 + 1;
      puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (puVar12 < (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish + (-0x10 - (long)puVar8));
  }
  pvVar13 = (void *)0x0;
  local_178 = (void *)0x0;
  pvVar10 = (void *)0x0;
  local_180 = (void *)0x0;
  iVar5 = 0;
LAB_00107e21:
  if (iVar5 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (moov_in,(long)pvVar10 - (long)local_180);
    lVar11 = (long)pvVar13 - (long)local_178;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (moov_in,(size_type)
                       ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish +
                       urn->_M_string_length +
                       (lVar11 - (long)(moov_in->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_start) + 1));
    local_150 = pvVar13;
    if (urn->_M_string_length != 0) {
      uVar15 = 0;
      do {
        uVar2 = (urn->_M_dataplus)._M_p[uVar15];
        local_170 = (undefined1 *)CONCAT71(local_170._1_7_,uVar2);
        iVar3._M_current =
             (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(moov_in,iVar3,(uchar *)&local_170);
        }
        else {
          *iVar3._M_current = uVar2;
          ppuVar1 = &(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < urn->_M_string_length);
    }
    pvVar10 = local_178;
    local_170 = (undefined1 *)((ulong)local_170 & 0xffffffffffffff00);
    iVar3._M_current =
         (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (moov_in,iVar3,(uchar *)&local_170);
    }
    else {
      *iVar3._M_current = '\0';
      ppuVar1 = &(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    if (local_150 != pvVar10) {
      lVar14 = 0;
      do {
        __args = (uchar *)((long)pvVar10 + lVar14);
        iVar3._M_current =
             (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)moov_in,iVar3,__args);
        }
        else {
          *iVar3._M_current = *__args;
          ppuVar1 = &(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar14 = lVar14 + 1;
      } while (lVar11 != lVar14);
    }
    puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar8) {
      uVar15 = 0;
      do {
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"stsd","");
        if ((((puVar8[uVar15] != *local_90[0]) || (puVar8[uVar15 + 1] != local_90[0][1])) ||
            (puVar8[uVar15 + 2] != local_90[0][2])) ||
           (bVar4 = true, puVar8[uVar15 + 3] != local_90[0][3])) {
          bVar4 = false;
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"stbl","");
        if (((puVar8[uVar15] != *local_b0[0]) || (puVar8[uVar15 + 1] != local_b0[0][1])) ||
           ((puVar8[uVar15 + 2] != local_b0[0][2] ||
            (bVar4 = true, puVar8[uVar15 + 3] != local_b0[0][3])))) {
          bVar4 = false;
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"uri ","");
        if (((puVar8[uVar15] != *local_d0[0]) || (puVar8[uVar15 + 1] != local_d0[0][1])) ||
           ((puVar8[uVar15 + 2] != local_d0[0][2] ||
            (bVar4 = true, puVar8[uVar15 + 3] != local_d0[0][3])))) {
          bVar4 = false;
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"urim","");
        if ((((puVar8[uVar15] != *local_f0[0]) || (puVar8[uVar15 + 1] != local_f0[0][1])) ||
            (puVar8[uVar15 + 2] != local_f0[0][2])) ||
           (bVar4 = true, puVar8[uVar15 + 3] != local_f0[0][3])) {
          bVar4 = false;
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"minf","");
        if (((puVar8[uVar15] != *local_110[0]) || (puVar8[uVar15 + 1] != local_110[0][1])) ||
           ((puVar8[uVar15 + 2] != local_110[0][2] ||
            (bVar4 = true, puVar8[uVar15 + 3] != local_110[0][3])))) {
          bVar4 = false;
        }
        if (local_110[0] != local_100) {
          operator_delete(local_110[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"mdia","");
        if (((puVar8[uVar15] != *local_130[0]) || (puVar8[uVar15 + 1] != local_130[0][1])) ||
           ((puVar8[uVar15 + 2] != local_130[0][2] ||
            (bVar4 = true, puVar8[uVar15 + 3] != local_130[0][3])))) {
          bVar4 = false;
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"trak","");
        if ((((puVar8[uVar15] != *local_50[0]) || (puVar8[uVar15 + 1] != local_50[0][1])) ||
            (puVar8[uVar15 + 2] != local_50[0][2])) ||
           (bVar4 = true, puVar8[uVar15 + 3] != local_50[0][3])) {
          bVar4 = false;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"moov","");
        if (((puVar8[uVar15] != *local_70[0]) || (puVar8[uVar15 + 1] != local_70[0][1])) ||
           ((puVar8[uVar15 + 2] != local_70[0][2] ||
            (bVar4 = true, puVar8[uVar15 + 3] != local_70[0][3])))) {
          bVar4 = false;
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (bVar4) {
          puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = *(uint *)(puVar8 + (uVar15 - 4));
          uVar7 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18)
                  - iVar5;
          *(uint *)(puVar8 + (uVar15 - 4)) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
        }
        uVar15 = uVar15 + 1;
        puVar8 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar15 < (ulong)((long)(moov_in->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar8));
    }
  }
  if (local_178 != (void *)0x0) {
    operator_delete(local_178);
  }
  if (local_180 != (void *)0x0) {
    operator_delete(local_180);
  }
  return;
}

Assistant:

void set_scheme_id_uri(std::vector<uint8_t> &moov_in, 
	const std::string& urn)
{
	int32_t size_diff = 0;

	std::vector<uint8_t> l_first;
	std::vector<uint8_t> l_last;

	// find the uri box containing the description of the urn, caerfull only use for the enclosed mdat box in the source code
	for (std::size_t k = 0; k < moov_in.size() - 16; k++)
	{
		if (std::string((char *)&moov_in[k]).compare("urim") == 0)
		{
			//cout << "urim box found" << endl;
			std::string or_urn = std::string((char *)&moov_in[k + 24]);
			size_diff = (int32_t)(or_urn.size() - urn.size());

			if (size_diff == 0)
			{
				for (std::size_t l = 0; l < urn.size(); l++)
					moov_in[k + 24 + l] = urn[l];
			}
			else
			{
				// first part of the string
				l_first = std::vector<uint8_t>(moov_in.begin(), moov_in.begin() + k + 24);
				// last part of the string
				l_last = std::vector<uint8_t>(moov_in.begin() + k + 24 + or_urn.size() + 1, moov_in.end());
			}
			break;
		}
	}

	// new string representing the moov_box 
	if (size_diff != 0)
	{
		// cout << "scheme size difference is: " << size_diff << endl;

		moov_in.resize(l_first.size());
		moov_in.reserve(moov_in.size() + urn.size() + l_last.size() + 1);

		for (std::size_t i = 0; i < urn.size(); i++)
			moov_in.push_back(urn[i]);
		moov_in.push_back('\0');
		for (std::size_t i = 0; i < l_last.size(); i++)
			moov_in.push_back(l_last[i]);

		for (std::size_t i = 0; i < moov_in.size(); i++)
		{
			if (compare_4cc((char *)&moov_in[i], std::string("stsd")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("stbl")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("uri ")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("urim")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("minf")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("mdia")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("trak")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("moov")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
		}
	}
}